

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord.hh
# Opt level: O3

void avro::codec_traits<testgen::_bigrecord_Union__1__>::decode(Decoder *d,_bigrecord_Union__1__ *v)

{
  placeholder *ppVar1;
  ulong uVar2;
  undefined8 *puVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vv;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  uVar2 = (**(code **)(*(long *)d + 0xb0))();
  if (1 < uVar2) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x18);
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Union index too big","");
    std::runtime_error::runtime_error((runtime_error *)(puVar3 + 1),(string *)&local_48);
    *puVar3 = 0x1c87a8;
    puVar3[1] = 0x1c87d8;
    __cxa_throw(puVar3,&Exception::typeinfo,Exception::~Exception);
  }
  if ((uVar2 & 1) == 0) {
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (**(code **)(*(long *)d + 0x58))(d);
    v->idx_ = 0;
    boost::any::operator=(&v->value_,&local_48);
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    (**(code **)(*(long *)d + 0x18))(d);
    v->idx_ = 1;
    ppVar1 = (v->value_).content;
    (v->value_).content = (placeholder *)0x0;
    if (ppVar1 != (placeholder *)0x0) {
      (*ppVar1->_vptr_placeholder[1])();
      return;
    }
  }
  return;
}

Assistant:

static void decode(Decoder& d, testgen::_bigrecord_Union__1__& v) {
        size_t n = d.decodeUnionIndex();
        if (n >= 2) { throw avro::Exception("Union index too big"); }
        switch (n) {
        case 0:
            {
                std::vector<uint8_t> vv;
                avro::decode(d, vv);
                v.set_bytes(vv);
            }
            break;
        case 1:
            d.decodeNull();
            v.set_null();
            break;
        }
    }